

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_print_mpi
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,mbedtls_mpi *X)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  bool bVar8;
  char str [512];
  char local_238 [520];
  
  if ((((ssl->conf != (mbedtls_ssl_config *)0x0) && (X != (mbedtls_mpi *)0x0)) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    sVar2 = X->n;
    do {
      sVar6 = sVar2;
      if (sVar6 == 1) {
        sVar6 = 1;
        sVar2 = 0;
        break;
      }
      sVar2 = sVar6 - 1;
    } while (X->p[sVar6 - 1] == 0);
    uVar3 = 0x3f;
    do {
      if ((X->p[sVar2] >> (uVar3 & 0x3f) & 1) != 0) goto LAB_0015897e;
      bVar8 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar8);
    uVar3 = 0xffffffff;
LAB_0015897e:
    snprintf(local_238,0x200,"value of \'%s\' (%d bits) is:\n",text,
             (ulong)((int)sVar2 * 0x40 + (int)uVar3 + 1));
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
    if (sVar6 == 0) {
      bVar8 = true;
      lVar5 = 0;
    }
    else {
      bVar8 = true;
      lVar5 = 0;
      uVar7 = 0;
      do {
        if ((!bVar8) || (bVar8 = true, X->p[sVar6 - 1] != 0)) {
          lVar4 = 0x38;
          do {
            if ((bVar8) && ((char)(X->p[sVar6 - 1] >> ((byte)lVar4 & 0x3f)) == '\0')) {
              bVar8 = true;
            }
            else {
              if (0 < (int)uVar7 && (uVar7 & 0xf) == 0) {
                snprintf(local_238 + lVar5,0x200 - lVar5,anon_var_dwarf_101e65 + 8);
                (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
                lVar5 = 0;
              }
              bVar8 = false;
              iVar1 = snprintf(local_238 + lVar5,0x200 - lVar5," %02x",
                               X->p[sVar6 - 1] >> ((byte)lVar4 & 0x3f) & 0xff);
              lVar5 = lVar5 + iVar1;
              uVar7 = uVar7 + 1;
            }
            lVar4 = lVar4 + -8;
          } while (lVar4 != -8);
        }
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
    }
    if (bVar8) {
      iVar1 = snprintf(local_238 + lVar5,0x200 - lVar5," 00");
      lVar5 = lVar5 + iVar1;
    }
    snprintf(local_238 + lVar5,0x200 - lVar5,anon_var_dwarf_101e65 + 8);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
  }
  return;
}

Assistant:

void mbedtls_debug_print_mpi( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, const mbedtls_mpi *X )
{
    char str[DEBUG_BUF_SIZE];
    int j, k, zeros = 1;
    size_t i, n, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || X == NULL || level > debug_threshold )
        return;

    for( n = X->n - 1; n > 0; n-- )
        if( X->p[n] != 0 )
            break;

    for( j = ( sizeof(mbedtls_mpi_uint) << 3 ) - 1; j >= 0; j-- )
        if( ( ( X->p[n] >> j ) & 1 ) != 0 )
            break;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "value of '%s' (%d bits) is:\n",
              text, (int) ( ( n * ( sizeof(mbedtls_mpi_uint) << 3 ) ) + j + 1 ) );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    for( i = n + 1, j = 0; i > 0; i-- )
    {
        if( zeros && X->p[i - 1] == 0 )
            continue;

        for( k = sizeof( mbedtls_mpi_uint ) - 1; k >= 0; k-- )
        {
            if( zeros && ( ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF ) == 0 )
                continue;
            else
                zeros = 0;

            if( j % 16 == 0 )
            {
                if( j > 0 )
                {
                    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
                    debug_send_line( ssl, level, file, line, str );
                    idx = 0;
                }
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x", (unsigned int)
                             ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF );

            j++;
        }

    }

    if( zeros == 1 )
        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " 00" );

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
    debug_send_line( ssl, level, file, line, str );
}